

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void state_DCL(Context *ctx)

{
  RegisterType rtype;
  int regnum_00;
  int writemask;
  int flags;
  int iVar1;
  int index_1;
  MOJOSHADER_usage usage_1;
  int index;
  MOJOSHADER_usage usage;
  int mods;
  int wmask;
  int regnum;
  RegisterType regtype;
  DestArgInfo *arg;
  Context *ctx_local;
  
  rtype = (ctx->dest_arg).regtype;
  regnum_00 = (ctx->dest_arg).regnum;
  writemask = (ctx->dest_arg).writemask;
  flags = (ctx->dest_arg).result_mod;
  if (ctx->instruction_count == 0) {
    iVar1 = shader_is_vertex(ctx);
    if (iVar1 == 0) {
      iVar1 = shader_is_pixel(ctx);
      if (iVar1 == 0) {
        fail(ctx,"unsupported shader type.");
        return;
      }
      if (rtype == REG_TYPE_SAMPLER) {
        add_sampler(ctx,regnum_00,ctx->dwords[0],0);
      }
      else {
        add_attribute_register(ctx,rtype,regnum_00,ctx->dwords[0],ctx->dwords[1],writemask,flags);
      }
    }
    else if (rtype == REG_TYPE_SAMPLER) {
      add_sampler(ctx,regnum_00,ctx->dwords[0],0);
    }
    else {
      if (MOJOSHADER_USAGE_SAMPLE < (int)ctx->dwords[0]) {
        fail(ctx,"unknown DCL usage");
        return;
      }
      add_attribute_register(ctx,rtype,regnum_00,ctx->dwords[0],ctx->dwords[1],writemask,flags);
    }
  }
  else {
    fail(ctx,"DCL token must come before any instructions");
  }
  set_defined_register(ctx,rtype,regnum_00);
  return;
}

Assistant:

static void state_DCL(Context *ctx)
{
    const DestArgInfo *arg = &ctx->dest_arg;
    const RegisterType regtype = arg->regtype;
    const int regnum = arg->regnum;
    const int wmask = arg->writemask;
    const int mods = arg->result_mod;

    // parse_args_DCL() does a lot of state checking before we get here.

    // !!! FIXME: apparently vs_3_0 can use sampler registers now.
    // !!! FIXME:  (but only s0 through s3, not all 16 of them.)

    if (ctx->instruction_count != 0)
        fail(ctx, "DCL token must come before any instructions");

    else if (shader_is_vertex(ctx))
    {
        if (regtype == REG_TYPE_SAMPLER)
            add_sampler(ctx, regnum, (TextureType) ctx->dwords[0], 0);
        else
        {
            const MOJOSHADER_usage usage = (const MOJOSHADER_usage) ctx->dwords[0];
            const int index = ctx->dwords[1];
            if (usage >= MOJOSHADER_USAGE_TOTAL)
            {
                fail(ctx, "unknown DCL usage");
                return;
            } // if
            add_attribute_register(ctx, regtype, regnum, usage, index, wmask, mods);
        } // else
    } // if

    else if (shader_is_pixel(ctx))
    {
        if (regtype == REG_TYPE_SAMPLER)
            add_sampler(ctx, regnum, (TextureType) ctx->dwords[0], 0);
        else
        {
            const MOJOSHADER_usage usage = (MOJOSHADER_usage) ctx->dwords[0];
            const int index = ctx->dwords[1];
            add_attribute_register(ctx, regtype, regnum, usage, index, wmask, mods);
        } // else
    } // else if

    else
    {
        fail(ctx, "unsupported shader type."); // should be caught elsewhere.
        return;
    } // else

    set_defined_register(ctx, regtype, regnum);
}